

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithAttributes
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyAttributes attributes,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  int iVar7;
  PropertyId propertyId_00;
  undefined4 *puVar8;
  PropertyRecord *pPVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  undefined7 in_register_00000081;
  uint uVar13;
  uint32 local_74;
  PropertyRecord *pPStack_70;
  uint32 debugIndex;
  PropertyRecord *propertyRecord;
  int i;
  PropertyValueInfo *local_58;
  Var local_50;
  ScriptContext *local_48;
  DictionaryPropertyDescriptor<int> *local_40;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  descriptor._4_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_48 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_58 = info;
  if (((flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None) &&
     (BVar5 = ScriptContext::IsNumericPropertyId(local_48,propertyId,&local_74), BVar5 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x724,
                                "(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)))"
                                ,
                                "!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex))"
                               );
    if (!bVar4) goto LAB_00dae01f;
    *puVar8 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x726,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00dae01f;
    *puVar8 = 0;
  }
  pPStack_70 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&stack0xffffffffffffff90,&local_40,
                     (int *)&propertyRecord);
  if (!bVar4) {
    if (pPStack_70->isNumeric != true) {
      BVar5 = AddProperty(this,instance,pPStack_70,value,descriptor._4_1_,local_58,flags,
                          SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0),
                          possibleSideEffects);
      return BVar5;
    }
    uVar6 = PropertyRecord::GetNumericValue(pPStack_70);
    iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2e])
                      (this,instance,(ulong)uVar6,value,(ulong)descriptor._4_1_);
    return iVar7;
  }
  if (((local_40->flags & (UsedAsFixed|IsFixed)) != None) &&
     (((local_40->Attributes & 8) != 0 ||
      (((local_40->Data == -1 && (local_40->Getter == -1)) && (local_40->Setter == -1)))))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72b,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar4) goto LAB_00dae01f;
    *puVar8 = 0;
  }
  uVar11 = descriptor._4_4_ & 0xff;
  bVar10 = local_40->Attributes;
  uVar12 = descriptor._4_4_;
  local_50 = value;
  if ((uVar11 & bVar10 & 0x10) != 0) goto LAB_00daddfb;
  uVar13 = descriptor._4_4_ & 0x10;
  if ((uVar13 == 0) && ((bVar10 & 8) != 0)) {
    if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                          (&this->super_DynamicTypeHandler,local_48,
                           SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0)), !bVar4))
    {
      return 0;
    }
    ScriptContext::InvalidateProtoCaches(local_48,propertyId);
    uVar12 = descriptor._4_4_;
    local_40->Attributes =
         (char)(local_40->Attributes * '\b') >> 7 & local_40->Attributes & 0xd0 |
         (byte)descriptor._4_4_;
    DictionaryPropertyDescriptor<int>::ConvertToData(local_40);
    value = local_50;
    goto LAB_00daddfb;
  }
  if ((local_40->flags & IsShadowed) != None) {
    local_40->Attributes = bVar10 & 0xd0 | (byte)descriptor._4_4_;
    goto LAB_00daddfb;
  }
  if (uVar13 != (bVar10 & 0x10)) {
    iVar7 = (this->super_DynamicTypeHandler).slotCapacity;
    if (iVar7 <= this->nextPropertyIndex) {
      if (0x3ffffffe < iVar7) {
        Throw::OutOfMemory();
      }
      EnsureSlotCapacity(this,instance,1);
    }
    bVar10 = local_40->Attributes & 0xc0 | (byte)descriptor._4_4_;
    if (uVar13 != 0) {
      bVar10 = (byte)descriptor._4_4_ & 0xc0 | local_40->Attributes;
    }
    local_40->Attributes = bVar10;
    DictionaryPropertyDescriptor<int>::AddShadowedData
              (local_40,&this->nextPropertyIndex,uVar13 != 0);
    if ((this->super_DynamicTypeHandler).slotCapacity < this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x765,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar4) goto LAB_00dae01f;
      *puVar8 = 0;
    }
    value = local_50;
    uVar12 = descriptor._4_4_;
    if (uVar13 != 0) {
      DynamicObject::ChangeType(instance);
      uVar12 = descriptor._4_4_;
    }
    goto LAB_00daddfb;
  }
  if ((local_40->flags & IsAccessor) != None && uVar13 == 0) {
    _i = JavascriptOperators::GetProperty
                   (&instance->super_RecyclableObject,0x67,local_48,(PropertyValueInfo *)0x0);
    if (((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
         TypeIds_GlobalObject) &&
       (bVar4 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar4)) {
      BVar5 = JavascriptOperators::IsClassConstructor(instance);
      if ((BVar5 == 0) && (BVar5 = JavascriptOperators::IsClassConstructor(_i), BVar5 == 0)) {
        BVar5 = JavascriptOperators::IsClassMethod(_i);
        if (((~uVar11 & 6) != 0) || (BVar5 == 0)) {
LAB_00dadd44:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x78a,
                                      "(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) || ((JavascriptOperators::IsClassConstructor(instance) || JavascriptOperators::IsClassConstructor(ctor) || JavascriptOperators::IsClassMethod(ctor)) && (attributes & (0x02|0x04)) == (0x02|0x04)))"
                                      ,
                                      "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property"
                                     );
          if (!bVar4) {
LAB_00dae01f:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
      }
      else if ((~uVar11 & 6) != 0) goto LAB_00dadd44;
    }
    bVar10 = local_40->Attributes;
    if ((bVar10 & 2) == 0) {
      if ((local_48 != (ScriptContext *)0x0) &&
         (bVar4 = ThreadContext::RecordImplicitException(local_48->threadContext), pSVar3 = local_48
         , bVar4)) {
        pPVar9 = ThreadContext::GetPropertyName(local_48->threadContext,propertyId);
        JavascriptError::ThrowTypeError(pSVar3,-0x7ff5ec2a,(PCWSTR)(pPVar9 + 1));
      }
    }
    else {
      DictionaryPropertyDescriptor<int>::ConvertToData(local_40);
      DynamicObject::ChangeType(instance);
    }
    if ((bVar10 & 2) == 0) {
      return 0;
    }
  }
  local_40->Attributes = local_40->Attributes & 0x10 | (byte)descriptor._4_4_;
  uVar12 = descriptor._4_4_;
LAB_00daddfb:
  if ((uVar12 & 0x10) == 0) {
    SetPropertyWithDescriptor<false>(this,instance,pPStack_70,&local_40,value,flags,local_58);
  }
  else {
    SetPropertyWithDescriptor<true>(this,instance,pPStack_70,&local_40,value,flags,local_58);
  }
  if (local_40 != (DictionaryPropertyDescriptor<int> *)0x0) {
    if ((local_40->Attributes & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&propertyRecord);
    propertyRecord = (PropertyRecord *)&pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyRecord);
    pPVar9 = propertyRecord;
    value = local_50;
    if (((local_40->Attributes & 4) == 0) &&
       (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
       pSVar3 = local_48, value = local_50, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
      propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_48,propertyId);
      ScriptContext::InvalidateStoreFieldCaches(pSVar3,propertyId_00);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)pPVar9);
      value = local_50;
    }
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,value,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

#ifdef DEBUG
        uint32 debugIndex;
        Assert(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)));
#endif
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (attributes & descriptor->Attributes & PropertyLetConstGlobal)
            {
                // Do not need to change the descriptor or its attributes if setting the initial value of a LetConstGlobal
            }
            else if (descriptor->Attributes & PropertyDeleted && !(attributes & PropertyLetConstGlobal))
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }

                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = attributes;
                }
                descriptor->ConvertToData();
            }
            else if (descriptor->GetIsShadowed())
            {
                descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
            }
            else if ((descriptor->Attributes & PropertyLetConstGlobal) != (attributes & PropertyLetConstGlobal))
            {
                // We could potentially need 1 new slot by AddShadowedData(), try pre-reserve
                if (this->GetSlotCapacity() <= nextPropertyIndex)
                {
                    if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
                    {
                        return ConvertToBigDictionaryTypeHandler(instance)->SetPropertyWithAttributes(
                            instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }

                    this->EnsureSlotCapacity(instance);
                }

                bool addingLetConstGlobal = (attributes & PropertyLetConstGlobal) != 0;

                if (addingLetConstGlobal)
                {
                    descriptor->Attributes = descriptor->Attributes | (attributes & PropertyNoRedecl);
                }
                else
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & PropertyNoRedecl);
                }

                descriptor->AddShadowedData(nextPropertyIndex, addingLetConstGlobal);

                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved above

                if (addingLetConstGlobal)
                {
                    // If shadowing a global property with a let/const, need to invalidate
                    // JIT fast path cache since look up could now go to the let/const instead
                    // of the global property.
                    //
                    // Do not need to invalidate when adding a global property that gets shadowed
                    // by an existing let/const, since all caches will still be correct.
                    instance->ChangeType();
                }
            }
            else
            {
                if (descriptor->GetIsAccessor() && !(attributes & PropertyLetConstGlobal))
                {
#if DEBUG
                    Var ctor = JavascriptOperators::GetProperty(instance, PropertyIds::constructor, scriptContext);
#endif
                    AssertMsg(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) ||
                        // ValidateAndApplyPropertyDescriptor says to preserve Configurable and Enumerable flags

                        // For InitRootFld, which is equivalent to
                        // CreateGlobalFunctionBinding called from GlobalDeclarationInstantiation in the spec,
                        // we can assume that the attributes specified include enumerable and writable.  Thus
                        // we don't need to preserve the original values of these two attributes and therefore
                        // do not need to change InitRootFld from being a SetPropertyWithAttributes API call to
                        // something else.  All we need to do is convert the descriptor to a data descriptor.
                        // Built-in Function.prototype properties 'length', 'arguments', and 'caller' are special cases.

                        ((JavascriptOperators::IsClassConstructor(instance) // Static method
                            || JavascriptOperators::IsClassConstructor(ctor)
                            || JavascriptOperators::IsClassMethod(ctor))
                            && (attributes & PropertyClassMemberDefaults) == PropertyClassMemberDefaults),
                        // 14.3.9: InitClassMember sets property descriptor to {writable:true, enumerable:false, configurable:true}

                        "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property");
                    if (!(descriptor->Attributes & PropertyConfigurable))
                    {
                        if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable, scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
                        }
                        return FALSE;
                    }
                    descriptor->ConvertToData();
                    instance->ChangeType();
                }

                // Make sure to keep the PropertyLetConstGlobal bit as is while taking the new attributes.
                descriptor->Attributes = attributes | (descriptor->Attributes & PropertyLetConstGlobal);
            }

            if (attributes & PropertyLetConstGlobal)
            {
                SetPropertyWithDescriptor<true>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            else
            {
                SetPropertyWithDescriptor<false>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            if (descriptor != nullptr)  //descriptor can dissappear, so this reference may not exist.
            {
                if (descriptor->Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, throwIfNotExtensible, possibleSideEffects);
    }